

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_KillSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int flags;
  int iVar1;
  int selector;
  AActor *origin;
  PClassActor *filter;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  AActor *source;
  AActor *inflictor;
  AActor *pAVar7;
  AActor *pAVar8;
  AActor *pAVar9;
  char *pcVar10;
  bool bVar11;
  TThinkerIterator<AActor> it;
  FName local_50;
  FName local_4c;
  FThinkerIterator local_48;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      origin = (AActor *)(param->field_0).field_1.a;
      if (origin != (AActor *)0x0) {
        if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
          (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (origin->super_DThinker).super_DObject.Class;
        bVar11 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar11) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar11 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar11) {
          pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003df84e;
        }
      }
      if (numparam == 1) {
        pVVar6 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003df86d:
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x17fb,
                        "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar6 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar10 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003df86d;
        }
      }
      iVar3 = pVVar6[1].field_0.i;
      if (numparam < 3) {
        pVVar6 = defaultparam->Array;
        if (pVVar6[2].field_0.field_3.Type != '\0') {
          pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003df88c;
        }
      }
      else {
        pVVar6 = param;
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003df88c:
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x17fc,
                        "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      flags = pVVar6[2].field_0.i;
      if (numparam < 4) {
        pVVar6 = defaultparam->Array;
        if ((pVVar6[3].field_0.field_3.Type != '\x03') ||
           ((pVVar5 = pVVar6 + 3, pVVar6[3].field_0.field_1.atag != 1 &&
            ((pVVar5->field_0).field_1.a != (void *)0x0)))) {
          pcVar10 = 
          "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
          ;
          goto LAB_003df82f;
        }
      }
      else if ((param[3].field_0.field_3.Type != '\x03') ||
              ((pVVar5 = param + 3, param[3].field_0.field_1.atag != 1 &&
               ((pVVar5->field_0).field_1.a != (void *)0x0)))) {
        pcVar10 = 
        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
        ;
LAB_003df82f:
        __assert_fail(pcVar10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17fd,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      filter = (PClassActor *)(pVVar5->field_0).field_1.a;
      if (numparam < 5) {
        pVVar6 = defaultparam->Array;
        if (pVVar6[4].field_0.field_3.Type != '\0') {
          pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003df8ab;
        }
      }
      else {
        pVVar6 = param;
        if (param[4].field_0.field_3.Type != '\0') {
          pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003df8ab:
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x17fe,
                        "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      iVar1 = pVVar6[4].field_0.i;
      if (numparam < 6) {
        pVVar6 = defaultparam->Array;
        if (pVVar6[5].field_0.field_3.Type != '\0') {
          pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003df8ca;
        }
      }
      else {
        pVVar6 = param;
        if (param[5].field_0.field_3.Type != '\0') {
          pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003df8ca:
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x17ff,
                        "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      if (numparam < 7) {
        param = defaultparam->Array;
        if (param[6].field_0.field_3.Type == '\0') goto LAB_003df6fd;
        pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[6].field_0.field_3.Type == '\0') {
LAB_003df6fd:
          selector = param[6].field_0.i;
          source = COPY_AAPTR(origin,pVVar6[5].field_0.i);
          inflictor = COPY_AAPTR(origin,selector);
          FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
          pAVar7 = (origin->master).field_0.p;
          if (pAVar7 != (AActor *)0x0) {
            if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
              pAVar7 = (AActor *)FThinkerIterator::Next(&local_48,false);
              if (pAVar7 != (AActor *)0x0) {
                do {
                  pAVar8 = (origin->master).field_0.p;
                  if ((pAVar8 != (AActor *)0x0) &&
                     (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (origin->master).field_0.p = (AActor *)0x0;
                    pAVar8 = (AActor *)0x0;
                  }
                  pAVar9 = (pAVar7->master).field_0.p;
                  if ((pAVar9 != (AActor *)0x0) &&
                     (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (pAVar7->master).field_0.p = (AActor *)0x0;
                    pAVar9 = (AActor *)0x0;
                  }
                  if (pAVar7 != origin && pAVar9 == pAVar8) {
                    local_50.Index = iVar1;
                    local_4c.Index = iVar3;
                    DoKill(pAVar7,inflictor,source,&local_4c,flags,filter,&local_50);
                  }
                  pAVar7 = (AActor *)FThinkerIterator::Next(&local_48,false);
                } while (pAVar7 != (AActor *)0x0);
              }
            }
            else {
              (origin->master).field_0.p = (AActor *)0x0;
            }
          }
          return 0;
        }
        pcVar10 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1800,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003df84e:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x17fa,
                "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KillSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ( (mo = it.Next()) )
		{
			if (mo->master == self->master && mo != self)
			{ 
				DoKill(mo, inflictor, source, damagetype, flags, filter, species);
			}
		}
	}
	return 0;
}